

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass1<false>
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  uint32 *puVar1;
  code *pcVar2;
  char cVar3;
  EncodedChar EVar4;
  bool bVar5;
  bool bVar6;
  Char CVar7;
  codepoint_t codePointValue;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  Node *pNVar11;
  MatchSetNode *pMVar12;
  undefined8 uVar13;
  MatchSetNode *pMVar14;
  MatchSetNode *pMVar15;
  AltNode *this_00;
  Char CVar16;
  byte bVar17;
  CharSet<unsigned_int> *pCVar18;
  Char CVar19;
  ArenaAllocator *allocator;
  uint lc;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar20;
  undefined1 local_908 [8];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  undefined1 local_3b8 [8];
  CharSet<unsigned_int> codePointSet;
  MatchSetNode deferredSetNode;
  MatchCharNode deferredCharNode;
  Char local_4c;
  char cStack_48;
  undefined7 uStack_47;
  codepoint_t upperCharOfRange;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_40;
  bool local_31 [8];
  bool previousWasASurrogate;
  
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_3b8);
  MatchSetNode::MatchSetNode
            ((MatchSetNode *)(codePointSet.characterPlanes[0x10].rep.full.direct.vec + 6),false,
             false);
  MatchCharNode::MatchCharNode((MatchCharNode *)(deferredSetNode.set.rep.full.direct.vec + 6),L'\0')
  ;
  EVar4 = ECLookahead(this,0);
  _cStack_48 = (MatchSetNode *)CONCAT71(uStack_47,EVar4);
  if (EVar4 == '^') {
    ECConsume(this,1);
  }
  local_40 = this;
  EVar4 = ECLookahead(this,0);
  local_31[0] = false;
  CVar19 = 0xffffffff;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  lc = 0xffffffff;
  bVar5 = false;
  bVar6 = false;
  do {
    pPVar20 = local_40;
    CVar16 = CVar19;
    if (EVar4 == '-') {
      if ((CVar19 == 0xffffffff || lc != 0xffffffff) ||
         (EVar4 = ECLookahead(local_40,1), EVar4 == ']')) {
        ECConsume(pPVar20,1);
        bVar17 = 0;
        CVar19 = 0x2d;
      }
      else {
        ECConsume(pPVar20,1);
        bVar17 = 0;
        CVar16 = 0xffffffff;
        lc = CVar19;
      }
    }
    else {
      if (EVar4 == '\\') {
        ECConsume(local_40,1);
        pNVar11 = ClassEscapePass1(pPVar20,(MatchCharNode *)
                                           (deferredSetNode.set.rep.full.direct.vec + 6),
                                   (MatchSetNode *)
                                   (codePointSet.characterPlanes[0x10].rep.full.direct.vec + 6),
                                   local_31);
        CVar7 = (Char)deferredCharNode.super_Node.followConsumes.lower;
        if (pNVar11->tag == MatchSet) {
          if (lc != 0xffffffff) {
            if (pPVar20->unicodeFlagPresent == true) {
              Fail(pPVar20,-0x7ff5e9d3);
            }
            CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,0x2d)
            ;
          }
          CharSet<unsigned_int>::UnionInPlace
                    ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,
                     (CharSet<char16_t> *)&deferredSetNode.isNegation);
          bVar17 = 1;
          CVar19 = 0xffffffff;
          lc = 0xffffffff;
          goto LAB_00d2fa60;
        }
      }
      else {
        if (EVar4 == ']') break;
        CVar7 = NextChar(local_40);
      }
      bVar17 = 0;
      CVar19 = (uint)(ushort)CVar7;
    }
LAB_00d2fa60:
    if (!(bool)(~bVar5 & CVar16 == 0xffffffff)) {
      if (bVar5) {
        if (pPVar20->unicodeFlagPresent == true) {
          Fail(pPVar20,-0x7ff5e9d3);
        }
        if (CVar19 != 0xffffffff) {
          CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,CVar19)
          ;
        }
        CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,0x2d);
      }
      else {
        if (lc == 0xffffffff) {
          CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,CVar16)
          ;
          lc = 0xffffffff;
          goto LAB_00d2fb40;
        }
        if (CVar19 < lc) {
          if (pPVar20->unicodeFlagPresent == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
            if (!bVar5) goto LAB_00d301c4;
            *puVar10 = 0;
          }
          Fail(pPVar20,-0x7ff5ec63);
        }
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,lc,CVar19);
      }
      CVar19 = 0xffffffff;
      lc = 0xffffffff;
    }
LAB_00d2fb40:
    EVar4 = ECLookahead(pPVar20,0);
    bVar5 = bVar6;
    bVar6 = (bool)(bVar17 & EVar4 == '-');
  } while( true );
  if (CVar19 != 0xffffffff) {
    CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b8,local_40->ctAllocator,CVar19);
  }
  cVar3 = cStack_48;
  if (pPVar20->unicodeFlagPresent == false) {
    uVar8 = CharSet<char16_t>::Count((CharSet<char16_t> *)local_3b8);
    uVar9 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)local_3b8);
    pPVar20 = local_40;
    if (uVar8 != uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                         "codePointSet.SimpleCharCount() == codePointSet.Count()");
      if (!bVar6) goto LAB_00d301c4;
      *puVar10 = 0;
    }
    pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar12,cVar3 == '^',true);
    allocator = pPVar20->ctAllocator;
    pCVar18 = (CharSet<unsigned_int> *)local_3b8;
  }
  else {
    if (((pPVar20->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e9,"(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                         "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
      if (!bVar6) goto LAB_00d301c4;
      *puVar10 = 0;
    }
    bVar6 = CharSet<unsigned_int>::IsEmpty((CharSet<unsigned_int> *)local_3b8);
    if (bVar6) {
      pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
      MatchSetNode::MatchSetNode(pMVar12,false,false);
      return &pMVar12->super_Node;
    }
    if (((cVar3 != '^') && (pPVar20->caseInsensitiveFlagPresent == false)) &&
       (bVar6 = CharSet<unsigned_int>::IsSingleton((CharSet<unsigned_int> *)local_3b8), bVar6)) {
      codePointValue = CharSet<unsigned_int>::Singleton((CharSet<unsigned_int> *)local_3b8);
      if (codePointValue < 0x10000) {
        pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x48,pPVar20->ctAllocator,0x35916e);
        MatchCharNode::MatchCharNode((MatchCharNode *)pMVar12,(Char)codePointValue);
      }
      else {
        if (pPVar20->unicodeFlagPresent == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
          if (!bVar6) goto LAB_00d301c4;
          *puVar10 = 0;
        }
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (codePointValue,(char16 *)local_908,
                   (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
        pPVar20 = local_40;
        pMVar12 = (MatchSetNode *)
                  CreateSurrogatePairAtom
                            (local_40,local_908._0_2_,
                             negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
      }
      CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator);
      return &pMVar12->super_Node;
    }
    CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_908);
    pCVar18 = (CharSet<unsigned_int> *)local_3b8;
    if (pPVar20->caseInsensitiveFlagPresent == false) {
      if (cVar3 == '^') {
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,
                   (CharSet<unsigned_int> *)local_908);
        pPVar20 = local_40;
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)local_3b8,local_40->ctAllocator);
        pCVar18 = (CharSet<unsigned_int> *)local_908;
      }
    }
    else {
      puVar1 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
      CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar1);
      CharSet<unsigned_int>::ToEquivClass
                ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,
                 (CharSet<unsigned_int> *)puVar1);
      uVar8 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)puVar1);
      uVar9 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)local_3b8);
      if (uVar8 < uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                           "caseEquivalent.Count() >= codePointSet.Count()");
        if (!bVar6) goto LAB_00d301c4;
        *puVar10 = 0;
      }
      if (cVar3 == '^') {
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator);
        puVar1 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)puVar1,pPVar20->ctAllocator,
                   (CharSet<unsigned_int> *)local_3b8);
        pPVar20 = local_40;
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)puVar1,local_40->ctAllocator);
      }
      else {
        CharSet<unsigned_int>::CloneFrom
                  ((CharSet<unsigned_int> *)local_3b8,pPVar20->ctAllocator,
                   (CharSet<unsigned_int> *)
                   (negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6));
      }
    }
    uVar8 = CharSet<unsigned_int>::Count(pCVar18);
    uVar9 = CharSet<char16_t>::Count(pCVar18->characterPlanes);
    if (uVar8 != uVar9) {
      if (uVar9 == 0) {
        _cStack_48 = (MatchSetNode *)0x0;
        pMVar12 = (MatchSetNode *)0x0;
      }
      else {
        bVar6 = CharSet<unsigned_int>::ContainSurrogateCodeUnits(pCVar18);
        pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
        MatchSetNode::MatchSetNode(pMVar12,false,false);
        if (bVar6) {
          CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                    (pCVar18,pPVar20->ctAllocator,&pMVar12->set);
          pMVar14 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
          MatchSetNode::MatchSetNode(pMVar14,false,false);
          _cStack_48 = pMVar14;
          CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                    (pCVar18,pPVar20->ctAllocator,&pMVar14->set);
        }
        else {
          CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar18,pPVar20->ctAllocator,&pMVar12->set);
          _cStack_48 = (MatchSetNode *)0x0;
        }
      }
      if (pPVar20->unicodeFlagPresent == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
        if (!bVar6) {
LAB_00d301c4:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar10 = 0;
      }
      if (pMVar12 == (MatchSetNode *)0x0) {
        pMVar14 = (MatchSetNode *)0x0;
      }
      else {
        pMVar14 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x60,pPVar20->ctAllocator,0x35916e);
        AltNode::AltNode((AltNode *)pMVar14,&pMVar12->super_Node,(AltNode *)0x0);
      }
      negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
      local_4c = 0;
      CVar19 = 0x10000;
      pMVar12 = pMVar14;
      do {
        bVar6 = CharSet<unsigned_int>::GetNextRange
                          (pCVar18,CVar19,
                           (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                           &local_4c);
        pPVar20 = local_40;
        pMVar15 = _cStack_48;
        if (!bVar6) {
          if (_cStack_48 != (MatchSetNode *)0x0) {
            this_00 = (AltNode *)new<Memory::ArenaAllocator>(0x60,local_40->ctAllocator,0x35916e);
            AltNode::AltNode(this_00,&pMVar15->super_Node,(AltNode *)0x0);
            (pMVar14->set).rep.full.root = (CharSetNode *)this_00;
          }
          CharSet<unsigned_int>::Clear(pCVar18,pPVar20->ctAllocator);
          if (pMVar12 != (MatchSetNode *)0x0) {
            if ((pMVar12->set).rep.compact.countPlusOne != 0) {
              return &pMVar12->super_Node;
            }
            uVar13._0_1_ = pMVar12->isNegation;
            uVar13._1_1_ = pMVar12->needsEquivClass;
            uVar13._2_6_ = *(undefined6 *)&pMVar12->field_0x3a;
            return (Node *)uVar13;
          }
          return &((MatchSetNode *)0x0)->super_Node;
        }
        if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_4c) {
          pMVar15 = (MatchSetNode *)
                    AppendSurrogatePairToDisjunction
                              (local_40,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               (AltNode *)pMVar14);
        }
        else {
          pMVar15 = (MatchSetNode *)
                    AppendSurrogateRangeToDisjunction
                              (local_40,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               local_4c,(AltNode *)pMVar14);
        }
        if (pMVar12 == (MatchSetNode *)0x0) {
          pMVar12 = pMVar15;
        }
        if (pMVar15 == (MatchSetNode *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
          if (!bVar6) goto LAB_00d301c4;
          *puVar10 = 0;
        }
        do {
          pMVar14 = pMVar15;
          pMVar15 = (MatchSetNode *)(pMVar14->set).rep.full.root;
        } while (pMVar15 != (MatchSetNode *)0x0);
        CVar19 = local_4c + 1;
      } while( true );
    }
    pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,pPVar20->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar12,cVar3 == '^',true);
    allocator = pPVar20->ctAllocator;
  }
  CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar18,allocator,&pMVar12->set);
  return &pMVar12->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }